

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O0

void bignum_mul(bn *a,bn *b,bn *c)

{
  uint64_t intermediate;
  int j;
  int i;
  bn tmp;
  bn row;
  bn *c_local;
  bn *b_local;
  bn *a_local;
  
  if (a == (bn *)0x0) {
    __assert_fail("a && \"\\\"a is null\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0xf6,"void bignum_mul(struct bn *, struct bn *, struct bn *)");
  }
  if (b == (bn *)0x0) {
    __assert_fail("b && \"\\\"b is null\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0xf7,"void bignum_mul(struct bn *, struct bn *, struct bn *)");
  }
  if (c == (bn *)0x0) {
    __assert_fail("c && \"\\\"c is null\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0xf8,"void bignum_mul(struct bn *, struct bn *, struct bn *)");
  }
  bignum_init(c);
  for (intermediate._4_4_ = 0; intermediate._4_4_ < 0x20;
      intermediate._4_4_ = intermediate._4_4_ + 1) {
    bignum_init((bn *)(tmp.array + 0x1e));
    for (intermediate._0_4_ = 0; (int)intermediate < 0x20;
        intermediate._0_4_ = (int)intermediate + 1) {
      if (intermediate._4_4_ + (int)intermediate < 0x20) {
        bignum_init((bn *)&j);
        bignum_from_int((bn *)&j,(ulong)a->array[intermediate._4_4_] *
                                 (ulong)b->array[(int)intermediate]);
        _lshift_word((bn *)&j,intermediate._4_4_ + (int)intermediate);
        bignum_add((bn *)&j,(bn *)(tmp.array + 0x1e),(bn *)(tmp.array + 0x1e));
      }
    }
    bignum_add(c,(bn *)(tmp.array + 0x1e),c);
  }
  return;
}

Assistant:

void bignum_mul(struct bn* a, struct bn* b, struct bn* c)
{
  require(a, "a is null");
  require(b, "b is null");
  require(c, "c is null");

  struct bn row;
  struct bn tmp;
  int i, j;

  bignum_init(c);

  for (i = 0; i < BN_ARRAY_SIZE; ++i)
  {
    bignum_init(&row);

    for (j = 0; j < BN_ARRAY_SIZE; ++j)
    {
      if (i + j < BN_ARRAY_SIZE)
      {
        bignum_init(&tmp);
        DTYPE_TMP intermediate = ((DTYPE_TMP)a->array[i] * (DTYPE_TMP)b->array[j]);
        bignum_from_int(&tmp, intermediate);
        _lshift_word(&tmp, i + j);
        bignum_add(&tmp, &row, &row);
      }
    }
    bignum_add(c, &row, c);
  }
}